

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

void sznet::net::sockets::sz_bindordie(sz_sock sockfd,sockaddr *addr)

{
  LogStream *this;
  SourceFile file;
  undefined1 local_1000 [12];
  Logger local_ff0;
  int local_1c;
  sockaddr *psStack_18;
  int ret;
  sockaddr *addr_local;
  sz_sock sockfd_local;
  
  psStack_18 = addr;
  addr_local._4_4_ = sockfd;
  local_1c = bind(sockfd,(sockaddr *)addr,0x10);
  if (local_1c < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_1000,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0x101,true);
    this = Logger::stream(&local_ff0);
    LogStream::operator<<(this,"sockets::sz_bindordie");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void sz_bindordie(sz_sock sockfd, const struct sockaddr* addr)
{
	int ret = ::bind(sockfd, addr, static_cast<socklen_t>(sizeof(struct sockaddr)));
	if (ret < 0)
	{
		LOG_SYSFATAL << "sockets::sz_bindordie";
	}
}